

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fInternalFormatQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FormatSamplesCase::iterate(FormatSamplesCase *this)

{
  GLenum GVar1;
  GLenum GVar2;
  code *pcVar3;
  ulong uVar4;
  size_t sVar5;
  int iVar6;
  deUint32 dVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  reference pvVar11;
  TestError *this_01;
  size_type sVar12;
  Enum<int,_2UL> EVar13;
  int local_f24;
  int local_e6c;
  MessageBuilder local_e58;
  MessageBuilder local_cd8;
  ulong local_b58;
  size_t ndx_2;
  ulong local_9d0;
  size_t ndx_1;
  size_t ndx;
  undefined1 local_9b8 [8];
  vector<int,_std::allocator<int>_> samples;
  MessageBuilder samplesMsg;
  MessageBuilder local_6a0;
  GetNameFunc local_520;
  int local_518;
  Enum<int,_2UL> local_510;
  MessageBuilder local_500;
  GetNameFunc local_380;
  int local_378;
  Enum<int,_2UL> local_370;
  MessageBuilder local_360;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0;
  MessageBuilder local_1c0;
  int local_40;
  GLenum samplesEnum;
  deUint32 local_30;
  ContextType local_2c;
  undefined1 local_25;
  int local_24;
  int iStack_20;
  bool supportsES32;
  GLint numSampleCounts;
  GLint maxSamples;
  bool error;
  bool isFloatFormat;
  Functions *gl;
  FormatSamplesCase *this_local;
  
  gl = (Functions *)this;
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar8->_vptr_RenderContext[3])();
  _maxSamples = CONCAT44(extraout_var,iVar6);
  numSampleCounts._3_1_ = 0;
  numSampleCounts._2_1_ = 0;
  iStack_20 = 0;
  local_24 = 0;
  pRVar8 = Context::getRenderContext((this->super_TestCase).m_context);
  local_2c.super_ApiType.m_bits = (ApiType)(*pRVar8->_vptr_RenderContext[2])();
  local_30 = (deUint32)glu::ApiType::es(3,2);
  local_25 = glu::contextSupports(local_2c,(ApiType)local_30);
  if ((bool)local_25) {
    if ((((this->m_internalFormat == 0x881a) || (this->m_internalFormat == 0x822e)) ||
        (this->m_internalFormat == 0x8230)) || (this->m_internalFormat == 0x8814)) {
      numSampleCounts._3_1_ = 1;
    }
  }
  else if (((((this->m_internalFormat == 0x881a) || (this->m_internalFormat == 0x822e)) ||
            ((this->m_internalFormat == 0x8230 ||
             ((this->m_internalFormat == 0x8814 || (this->m_internalFormat == 0x822d)))))) ||
           (this->m_internalFormat == 0x822f)) || (this->m_internalFormat == 0x8c3a)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"The internal format is not supported in a context lower than 3.2",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
               ,99);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  if (this->m_type == FORMAT_COLOR) {
    local_e6c = 0x910e;
  }
  else {
    local_e6c = 0x910f;
    if (this->m_type == FORMAT_INT) {
      local_e6c = 0x9110;
    }
  }
  local_40 = local_e6c;
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1c0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<
                      (&local_1c0,(char (*) [37])"Format must support sample count of ");
  EVar13 = glu::getGettableStateStr(local_40);
  local_1e0 = EVar13.m_getName;
  local_1d8 = EVar13.m_value;
  local_1d0.m_getName = local_1e0;
  local_1d0.m_value = local_1d8;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1d0);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  (**(code **)(_maxSamples + 0x868))(local_40,&stack0xffffffffffffffe0);
  dVar7 = (**(code **)(_maxSamples + 0x800))();
  glu::checkError(dVar7,"get MAX_*_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x71);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_360,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  EVar13 = glu::getGettableStateStr(local_40);
  local_380 = EVar13.m_getName;
  local_378 = EVar13.m_value;
  local_370.m_getName = local_380;
  local_370.m_value = local_378;
  pMVar10 = tcu::MessageBuilder::operator<<(&local_360,&local_370);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [4])0xf0b6ce);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&stack0xffffffffffffffe0);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_360);
  if (iStack_20 < 1) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_500,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<(&local_500,(char (*) [25])"ERROR: minimum value of ");
    EVar13 = glu::getGettableStateStr(local_40);
    local_520 = EVar13.m_getName;
    local_518 = EVar13.m_value;
    local_510.m_getName = local_520;
    local_510.m_value = local_518;
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_510);
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])" is 1");
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_500);
    numSampleCounts._2_1_ = 1;
  }
  (**(code **)(_maxSamples + 0x880))(this->m_target,this->m_internalFormat,0x9380,1,&local_24);
  dVar7 = (**(code **)(_maxSamples + 0x800))();
  glu::checkError(dVar7,"get GL_NUM_SAMPLE_COUNTS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x7f);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_6a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_6a0,(char (*) [24])0xf3ddf3);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_24);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6a0);
  if (((numSampleCounts._3_1_ & 1) == 0) && (local_24 < 1)) {
    pTVar9 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&samplesMsg.field_0x178,pTVar9,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar10 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&samplesMsg.field_0x178,
                         (char (*) [87])
                         "ERROR: Format MUST support some multisample configuration, got GL_NUM_SAMPLE_COUNTS = "
                        );
    pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_24);
    tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&samplesMsg.field_0x178);
    numSampleCounts._2_1_ = 1;
  }
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::MessageBuilder::MessageBuilder
            ((MessageBuilder *)
             &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,pTVar9);
  if (local_24 < 1) {
    local_f24 = 1;
  }
  else {
    local_f24 = local_24;
  }
  std::allocator<int>::allocator((allocator<int> *)((long)&ndx + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_9b8,(long)local_f24,
             (allocator<int> *)((long)&ndx + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&ndx + 7));
  iVar6 = local_24;
  if ((local_24 < 1) && ((numSampleCounts._3_1_ & 1) == 0)) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"glGetInternalFormativ() reported 0 supported sample counts",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
               ,0x98);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pcVar3 = *(code **)(_maxSamples + 0x880);
  GVar1 = this->m_target;
  GVar2 = this->m_internalFormat;
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)local_9b8,0);
  (*pcVar3)(GVar1,GVar2,0x80a9,iVar6,pvVar11);
  dVar7 = (**(code **)(_maxSamples + 0x800))();
  glu::checkError(dVar7,"get GL_SAMPLES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fInternalFormatQueryTests.cpp"
                  ,0x95);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)
             &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(char (*) [15])"GL_SAMPLES = [");
  for (ndx_1 = 0; sVar5 = ndx_1,
      sVar12 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)local_9b8), sVar5 < sVar12;
      ndx_1 = ndx_1 + 1) {
    if (ndx_1 != 0) {
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)
                 &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(char (*) [3])0xf95514);
    }
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_9b8,ndx_1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)
               &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,pvVar11);
  }
  pMVar10 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)
                       &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(char (*) [2])0xf2b90f);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  for (local_9d0 = 1; uVar4 = local_9d0,
      sVar12 = std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)local_9b8), uVar4 < sVar12;
      local_9d0 = local_9d0 + 1) {
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_9b8,local_9d0 - 1);
    iVar6 = *pvVar11;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_9b8,local_9d0);
    if (iVar6 <= *pvVar11) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&ndx_2,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&ndx_2,
                           (char (*) [43])"ERROR: Samples must be ordered descending.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&ndx_2);
      numSampleCounts._2_1_ = 1;
      break;
    }
  }
  local_b58 = 1;
  do {
    uVar4 = local_b58;
    sVar12 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)local_9b8);
    if (sVar12 <= uVar4) {
LAB_0081acee:
      if (((numSampleCounts._3_1_ & 1) == 0) &&
         (pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_9b8,0),
         *pvVar11 < iStack_20)) {
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_e58,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (&local_e58,(char (*) [40])"ERROR: MAX_*_SAMPLES must be supported.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_e58);
        numSampleCounts._2_1_ = 1;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_9b8);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)
                 &samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      if ((numSampleCounts._2_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Invalid value");
      }
      return STOP;
    }
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_9b8,local_b58 - 1);
    if (*pvVar11 < 1) {
      pTVar9 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_cd8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_cd8,(char (*) [38])"ERROR: Only positive SAMPLES allowed.");
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_cd8);
      numSampleCounts._2_1_ = 1;
      goto LAB_0081acee;
    }
    local_b58 = local_b58 + 1;
  } while( true );
}

Assistant:

FormatSamplesCase::IterateResult FormatSamplesCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	bool					isFloatFormat	= false;
	bool					error			= false;
	glw::GLint				maxSamples		= 0;
	glw::GLint				numSampleCounts	= 0;
	const bool				supportsES32			= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32)
	{
		if (m_internalFormat == GL_RGBA16F || m_internalFormat == GL_R32F || m_internalFormat == GL_RG32F || m_internalFormat == GL_RGBA32F || m_internalFormat == GL_R16F || m_internalFormat == GL_RG16F || m_internalFormat == GL_R11F_G11F_B10F)
		{
			TCU_THROW(NotSupportedError, "The internal format is not supported in a context lower than 3.2");
		}
	}
	else if (m_internalFormat == GL_RGBA16F || m_internalFormat == GL_R32F || m_internalFormat == GL_RG32F || m_internalFormat == GL_RGBA32F)
	{
		isFloatFormat = true;
	}

	// Lowest limit
	{
		const glw::GLenum samplesEnum = (m_type == FORMAT_COLOR) ? (GL_MAX_COLOR_TEXTURE_SAMPLES) : (m_type == FORMAT_INT) ? (GL_MAX_INTEGER_SAMPLES) : (GL_MAX_DEPTH_TEXTURE_SAMPLES);
		m_testCtx.getLog() << tcu::TestLog::Message << "Format must support sample count of " << glu::getGettableStateStr(samplesEnum) << tcu::TestLog::EndMessage;

		gl.getIntegerv(samplesEnum, &maxSamples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get MAX_*_SAMPLES");

		m_testCtx.getLog() << tcu::TestLog::Message << glu::getGettableStateStr(samplesEnum) << " = " << maxSamples << tcu::TestLog::EndMessage;

		if (maxSamples < 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: minimum value of "  << glu::getGettableStateStr(samplesEnum) << " is 1" << tcu::TestLog::EndMessage;
			error = true;
		}
	}

	// Number of sample counts
	{
		gl.getInternalformativ(m_target, m_internalFormat, GL_NUM_SAMPLE_COUNTS, 1, &numSampleCounts);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_NUM_SAMPLE_COUNTS");

		m_testCtx.getLog() << tcu::TestLog::Message << "GL_NUM_SAMPLE_COUNTS = " << numSampleCounts << tcu::TestLog::EndMessage;

		if (!isFloatFormat)
		{
			if (numSampleCounts < 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Format MUST support some multisample configuration, got GL_NUM_SAMPLE_COUNTS = " << numSampleCounts << tcu::TestLog::EndMessage;
				error = true;
			}
		}
	}

	// Sample counts
	{
		tcu::MessageBuilder		samplesMsg	(&m_testCtx.getLog());
		std::vector<glw::GLint>	samples		(numSampleCounts > 0 ? numSampleCounts : 1);

		if (numSampleCounts > 0 || isFloatFormat)
		{
			gl.getInternalformativ(m_target, m_internalFormat, GL_SAMPLES, numSampleCounts, &samples[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "get GL_SAMPLES");
		}
		else
			TCU_FAIL("glGetInternalFormativ() reported 0 supported sample counts");

		// make a pretty log

		samplesMsg << "GL_SAMPLES = [";
		for (size_t ndx = 0; ndx < samples.size(); ++ndx)
		{
			if (ndx)
				samplesMsg << ", ";
			samplesMsg << samples[ndx];
		}
		samplesMsg << "]" << tcu::TestLog::EndMessage;

		// Samples are in order
		for (size_t ndx = 1; ndx < samples.size(); ++ndx)
		{
			if (samples[ndx-1] <= samples[ndx])
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Samples must be ordered descending." << tcu::TestLog::EndMessage;
				error = true;
				break;
			}
		}

		// samples are positive
		for (size_t ndx = 1; ndx < samples.size(); ++ndx)
		{
			if (samples[ndx-1] <= 0)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: Only positive SAMPLES allowed." << tcu::TestLog::EndMessage;
				error = true;
				break;
			}
		}

		// maxSamples must be supported
		if (!isFloatFormat)
		{
			if (samples[0] < maxSamples)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "ERROR: MAX_*_SAMPLES must be supported." << tcu::TestLog::EndMessage;
				error = true;
			}
		}
	}

	// Result
	if (!error)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");

	return STOP;
}